

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

void __thiscall
spirv_cross::CompilerGLSL::propagate_nonuniform_qualifier(CompilerGLSL *this,uint32_t id)

{
  Variant *pVVar1;
  size_t sVar2;
  TypedID<(spirv_cross::Types)0> *pTVar3;
  bool bVar4;
  SPIRExpression *pSVar5;
  SPIRCombinedImageSampler *pSVar6;
  ulong uVar7;
  SPIRAccessChain *pSVar8;
  ulong uVar9;
  long lVar10;
  
  uVar9 = (ulong)id;
  while( true ) {
    bVar4 = Compiler::has_decoration(&this->super_Compiler,(ID)(uint32_t)uVar9,DecorationNonUniform)
    ;
    if (!bVar4) {
      Compiler::set_decoration(&this->super_Compiler,(ID)(uint32_t)uVar9,DecorationNonUniform,0);
      Compiler::force_recompile(&this->super_Compiler);
    }
    uVar7 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size;
    if ((uVar9 < uVar7) &&
       (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar9].type == TypeExpression)) {
      pSVar5 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar9);
      uVar7 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size;
    }
    else {
      pSVar5 = (SPIRExpression *)0x0;
    }
    if ((uVar9 < uVar7) &&
       (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar9].type == TypeCombinedImageSampler)) {
      pSVar6 = Variant::get<spirv_cross::SPIRCombinedImageSampler>(pVVar1 + uVar9);
      uVar7 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size;
    }
    else {
      pSVar6 = (SPIRCombinedImageSampler *)0x0;
    }
    if ((uVar9 < uVar7) &&
       (pVVar1 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar1[uVar9].type == TypeAccessChain)) {
      pSVar8 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar1 + uVar9);
    }
    else {
      pSVar8 = (SPIRAccessChain *)0x0;
    }
    if (pSVar5 != (SPIRExpression *)0x0) break;
    if (pSVar6 == (SPIRCombinedImageSampler *)0x0) {
      if ((pSVar8 != (SPIRAccessChain *)0x0) &&
         (sVar2 = (pSVar8->implied_read_expressions).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size,
         sVar2 != 0)) {
        pTVar3 = (pSVar8->implied_read_expressions).
                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
        lVar10 = 0;
        do {
          propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar3->id + lVar10));
          lVar10 = lVar10 + 4;
        } while (sVar2 << 2 != lVar10);
      }
      return;
    }
    propagate_nonuniform_qualifier(this,(pSVar6->image).id);
    uVar9 = (ulong)(pSVar6->sampler).id;
  }
  sVar2 = (pSVar5->expression_dependencies).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (pSVar5->expression_dependencies).
             super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    lVar10 = 0;
    do {
      propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar3->id + lVar10));
      lVar10 = lVar10 + 4;
    } while (sVar2 << 2 != lVar10);
  }
  sVar2 = (pSVar5->implied_read_expressions).
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    return;
  }
  pTVar3 = (pSVar5->implied_read_expressions).
           super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
  lVar10 = 0;
  do {
    propagate_nonuniform_qualifier(this,*(uint32_t *)((long)&pTVar3->id + lVar10));
    lVar10 = lVar10 + 4;
  } while (sVar2 << 2 != lVar10);
  return;
}

Assistant:

void CompilerGLSL::propagate_nonuniform_qualifier(uint32_t id)
{
	// SPIR-V might only tag the very last ID with NonUniformEXT, but for codegen,
	// we need to know NonUniformEXT a little earlier, when the resource is actually loaded.
	// Back-propagate the qualifier based on the expression dependency chain.

	if (!has_decoration(id, DecorationNonUniformEXT))
	{
		set_decoration(id, DecorationNonUniformEXT);
		force_recompile();
	}

	auto *e = maybe_get<SPIRExpression>(id);
	auto *combined = maybe_get<SPIRCombinedImageSampler>(id);
	auto *chain = maybe_get<SPIRAccessChain>(id);
	if (e)
	{
		for (auto &expr : e->expression_dependencies)
			propagate_nonuniform_qualifier(expr);
		for (auto &expr : e->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
	else if (combined)
	{
		propagate_nonuniform_qualifier(combined->image);
		propagate_nonuniform_qualifier(combined->sampler);
	}
	else if (chain)
	{
		for (auto &expr : chain->implied_read_expressions)
			propagate_nonuniform_qualifier(expr);
	}
}